

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Rebalancing::Node>::Stack
          (Stack<Kernel::Rebalancing::Node> *this,Stack<Kernel::Rebalancing::Node> *s)

{
  BottomFirstIterator it;
  Stack<Kernel::Rebalancing::Node> *in_RSI;
  size_t *in_RDI;
  void *mem;
  Stack<Kernel::Rebalancing::Node> *in_stack_ffffffffffffffe0;
  Node *in_stack_ffffffffffffffe8;
  
  *in_RDI = in_RSI->_capacity;
  if (*in_RDI == 0) {
    in_RDI[1] = 0;
  }
  else {
    in_stack_ffffffffffffffe8 = (Node *)Lib::alloc((size_t)in_RDI);
    in_RDI[1] = (size_t)in_stack_ffffffffffffffe8;
  }
  in_RDI[2] = in_RDI[1];
  in_RDI[3] = in_RDI[1] + *in_RDI * 0x10;
  BottomFirstIterator::BottomFirstIterator((BottomFirstIterator *)&stack0xffffffffffffffd8,in_RSI);
  it._afterLast = (Node *)in_RSI;
  it._pointer = in_stack_ffffffffffffffe8;
  loadFromIterator<Lib::Stack<Kernel::Rebalancing::Node>::BottomFirstIterator>
            (in_stack_ffffffffffffffe0,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }